

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-try-send.c
# Opt level: O0

int run_test_udp_try_send(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  undefined1 auVar3 [16];
  int64_t eval_b_12;
  int64_t eval_a_12;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  undefined8 uStack_30;
  int r;
  uv_buf_t buf;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&buf.len);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-try-send.c"
            ,0x57,"uv_ip4_addr(\"0.0.0.0\", 9123, &addr)","==","0",(long)iVar1,"==",0);
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_udp_init(uVar2,&server);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-try-send.c"
            ,0x5a,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_udp_bind(&server,&buf.len,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-try-send.c"
            ,0x5d,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_udp_recv_start(&server,alloc_cb,sv_recv_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-try-send.c"
            ,0x60,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&buf.len);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-try-send.c"
            ,0x62,"uv_ip4_addr(\"127.0.0.1\", 9123, &addr)","==","0",(long)iVar1,"==",0);
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_udp_init(uVar2,&client);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-try-send.c"
            ,0x65,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  auVar3 = uv_buf_init(run_test_udp_try_send::buffer,0x10000);
  buf.base = auVar3._8_8_;
  uStack_30 = auVar3._0_8_;
  iVar1 = uv_udp_try_send(&client,&stack0xffffffffffffffd0,1,&buf.len);
  if ((long)iVar1 != -0x5a) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-try-send.c"
            ,0x69,"r","==","UV_EMSGSIZE",(long)iVar1,"==",0xffffffffffffffa6);
    abort();
  }
  auVar3 = uv_buf_init("EXIT",4);
  buf.base = auVar3._8_8_;
  uStack_30 = auVar3._0_8_;
  iVar1 = uv_udp_try_send(&client,&stack0xffffffffffffffd0,1,&buf.len);
  if ((long)iVar1 != 4) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-try-send.c"
            ,0x6d,"4","==","r",4,"==",(long)iVar1);
    abort();
  }
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  if ((long)close_cb_called != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-try-send.c"
            ,0x71,"2","==","close_cb_called",2,"==",(long)close_cb_called);
    abort();
  }
  if ((long)sv_recv_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-try-send.c"
            ,0x72,"1","==","sv_recv_cb_called",1,"==",(long)sv_recv_cb_called);
    abort();
  }
  if (client.send_queue_size != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-try-send.c"
            ,0x74,"client.send_queue_size","==","0",client.send_queue_size,"==",0);
    abort();
  }
  if (server.send_queue_size != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-try-send.c"
            ,0x75,"server.send_queue_size","==","0",server.send_queue_size,"==",0);
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-try-send.c"
            ,0x77,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(udp_try_send) {
  struct sockaddr_in addr;
  static char buffer[64 * 1024];
  uv_buf_t buf;
  int r;

  ASSERT_OK(uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT_OK(r);

  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT_OK(r);

  r = uv_udp_recv_start(&server, alloc_cb, sv_recv_cb);
  ASSERT_OK(r);

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_OK(r);

  buf = uv_buf_init(buffer, sizeof(buffer));
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &addr);
  ASSERT_EQ(r, UV_EMSGSIZE);

  buf = uv_buf_init("EXIT", 4);
  r = uv_udp_try_send(&client, &buf, 1, (const struct sockaddr*) &addr);
  ASSERT_EQ(4, r);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(2, close_cb_called);
  ASSERT_EQ(1, sv_recv_cb_called);

  ASSERT_OK(client.send_queue_size);
  ASSERT_OK(server.send_queue_size);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}